

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeTransformMatrixAtPoint
          (ChElementBeamTaperedTimoshenko *this,ChMatrixDynamic<> *mT,double eta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 in_XMM0_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChMatrixNM<double,_6,_6> Rotsect;
  ChMatrix33<double> RotsectA;
  ChMatrixNM<double,_6,_6> Tc;
  ChMatrixNM<double,_6,_6> Ts;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  __shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  local_420;
  undefined8 uStack_410;
  double local_378 [15];
  Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
  local_300;
  ChMatrix33<double> local_2e8;
  Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> local_2a0;
  undefined8 local_258;
  ulong local_228;
  Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_180 [4];
  undefined8 local_138;
  undefined8 local_108;
  
  dVar1 = eta;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&mT->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,6,6);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[6])();
  dVar2 = dVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[7])();
  local_470._8_8_ = in_XMM0_Qb;
  local_470._0_8_ = dVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[8])();
  local_480._8_8_ = in_XMM0_Qb;
  local_480._0_8_ = dVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[9])();
  dVar3 = dVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[10])();
  local_490._8_8_ = in_XMM0_Qb;
  local_490._0_8_ = dVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[6])();
  dVar4 = dVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[7])();
  dVar5 = dVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[8])();
  dVar6 = dVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[9])();
  dVar7 = dVar6;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_420,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_420._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[10])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  dVar1 = (1.0 - eta) * 0.5;
  dVar2 = (eta + 1.0) * 0.5;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2 * dVar3;
  auVar10 = vfmadd213sd_fma(auVar18,auVar11,auVar13);
  local_420._M_ptr = auVar10._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * dVar4;
  auVar10 = vfmadd213sd_fma(local_470,auVar11,auVar14);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2 * dVar5;
  auVar11 = vfmadd213sd_fma(local_480,auVar12,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * dVar6;
  auVar13 = vfmadd213sd_fma(auVar19,auVar12,auVar16);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2 * dVar7;
  auVar8 = vfmadd213sd_fma(local_490,auVar12,auVar8);
  local_420._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_410 = 0;
  ChMatrix33<double>::Set_A_Rxyz(&local_2e8,(ChVector<double> *)&local_420);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_420);
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>.m_data =
       (PointerType)&local_420;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_xpr =
       (XprTypeNested)&local_420;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            (&local_2a0,&local_2e8.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>.m_data =
       local_378;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startRow.m_value
       = 3;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = 3;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_outerStride = 6;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_xpr =
       (XprTypeNested)&local_420;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            (&local_2a0,&local_2e8.super_Matrix<double,_3,_3,_1,_3,_3>);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run
            ((Matrix<double,_6,_6,_1,_6,_6> *)&local_2a0);
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startCol.m_value
       = auVar11._0_8_;
  local_228 = auVar10._0_8_;
  auVar9._0_8_ = local_228 ^ 0x8000000000000000;
  auVar9._8_4_ = auVar10._8_4_;
  auVar9._12_4_ = auVar10._12_4_ ^ 0x80000000;
  auVar17._0_8_ =
       local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_startCol.
       m_value ^ 0x8000000000000000;
  auVar17._8_4_ = auVar11._8_4_;
  auVar17._12_4_ = auVar11._12_4_ ^ 0x80000000;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false,_true>.m_outerStride =
       vmovlps_avx(auVar9);
  local_258 = vmovlps_avx(auVar17);
  local_180[0] = Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)&local_2a0,
                            (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Rc);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((Matrix<double,_6,_6,_1,_6,_6> *)&local_2a0,local_180);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run
            ((Matrix<double,_6,_6,_1,_6,_6> *)local_180);
  local_490._8_4_ = auVar8._8_4_;
  local_490._12_4_ = auVar8._12_4_;
  auVar10._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
  auVar10._8_4_ = local_490._8_4_;
  auVar10._12_4_ = local_490._12_4_ ^ 0x80000000;
  local_138 = vmovlps_avx(auVar10);
  local_108 = auVar13._0_8_;
  local_300.m_lhs =
       (LhsNested)
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Rs,
                  (MatrixBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_180);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>>
            ((Matrix<double,_6,_6,_1,_6,_6> *)local_180,
             (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
              *)&local_300);
  local_300.m_lhs.m_rhs = (RhsNested)local_180;
  local_300.m_lhs.m_lhs = (LhsNested)&local_420;
  local_300.m_rhs = (RhsNested)&local_2a0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,6,1,6,6>,0>>
            (mT,&local_300);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeTransformMatrixAtPoint(ChMatrixDynamic<>& mT, const double eta) {
    mT.resize(6, 6);

    double alpha1 = this->tapered_section->GetSectionA()->GetSectionRotation();
    double Cy1 = this->tapered_section->GetSectionA()->GetCentroidY();
    double Cz1 = this->tapered_section->GetSectionA()->GetCentroidZ();
    double Sy1 = this->tapered_section->GetSectionA()->GetShearCenterY();
    double Sz1 = this->tapered_section->GetSectionA()->GetShearCenterZ();

    double alpha2 = this->tapered_section->GetSectionB()->GetSectionRotation();
    double Cy2 = this->tapered_section->GetSectionB()->GetCentroidY();
    double Cz2 = this->tapered_section->GetSectionB()->GetCentroidZ();
    double Sy2 = this->tapered_section->GetSectionB()->GetShearCenterY();
    double Sz2 = this->tapered_section->GetSectionB()->GetShearCenterZ();

    // double L = this->length;

    // The shear center offset is respect to the centerline of beam element.
    /*Sy1 = Sy1 - Cy1;  // Unnecessary to do this substraction
    Sz1 = Sz1 - Cz1;
    Sy2 = Sy2 - Cy2;
    Sz2 = Sz2 - Cz2;*/

    // calculate the orientation angle and centers by linear interpolation
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double alpha = Nx1 * alpha1 + Nx2 * alpha2;
    double Cy = Nx1 * Cy1 + Nx2 * Cy2;
    double Cz = Nx1 * Cz1 + Nx2 * Cz2;
    double Sy = Nx1 * Sy1 + Nx2 * Sy2;
    double Sz = Nx1 * Sz1 + Nx2 * Sz2;

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(alpha, 0, 0));
    ChMatrixNM<double, 6, 6> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;

    // In case the section has a centroid displacement:
    ChMatrixNM<double, 6, 6> Tc;
    Tc.setIdentity();
    Tc(0, 4) = Cz;
    Tc(0, 5) = -Cy;
    Tc(1, 3) = -Cz;
    Tc(2, 3) = Cy;

    Tc = Tc * this->Rc;

    // In case the section has a shear center displacement:
    ChMatrixNM<double, 6, 6> Ts;
    Ts.setIdentity();
    Ts(1, 3) = -Sz;
    Ts(2, 3) = Sy;

    Ts = this->Rs * Ts;

    // the transformation matrix at point eta:
    mT = Rotsect * Ts * Tc;
}